

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

size_t __thiscall
PlanningUnitMADPDiscrete::GetNrJointActionHistories(PlanningUnitMADPDiscrete *this)

{
  size_type sVar1;
  long in_RDI;
  size_t nr;
  
  sVar1 = std::
          vector<TreeNode<JointActionHistory>_*,_std::allocator<TreeNode<JointActionHistory>_*>_>::
          size((vector<TreeNode<JointActionHistory>_*,_std::allocator<TreeNode<JointActionHistory>_*>_>
                *)(in_RDI + 0x250));
  return sVar1;
}

Assistant:

size_t PlanningUnitMADPDiscrete::GetNrJointActionHistories() const
{
/* incorrect calculation (takes cartesian product over action histories
 * of different time-steps...)
 * size_t nrJointActionHistories = 1;
    size_t nrAgents = GetNrAgents();
    for(Index agentI=0; agentI < nrAgents; agentI++)
    nrJointActionHistories *= GetNrActionHistories(agentI);

    if( nrJointActionHistories != _m_jointActionHistoryTreeVector.
        size() )
    cerr << "WARNING: PlanningUnitMADPDiscrete::GetNrJointActionHistories() - nrJointActionHistories (= "<< nrJointActionHistories <<" ) != _m_jointActionHistoryTreeVector.size() (= "<< _m_jointActionHistoryTreeVector.size() <<" ) !!"<<endl; */
    size_t nr = _m_jointActionHistoryTreeVector.size();
//    cerr << " _m_jointActionHistoryTreeVector.size() = "<< _m_jointActionHistoryTreeVector.size() << " - nr = " << nr << endl;
    return nr;    
}